

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::Compact(ON_Mesh *this)

{
  int iVar1;
  long lVar2;
  int i;
  uint i_00;
  long lVar3;
  
  iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count != (this->m_F).m_count) {
    ON_SimpleArray<ON_3fVector>::Destroy(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
  }
  if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar1) {
    ON_SimpleArray<ON_3fVector>::Destroy(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  }
  if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != iVar1) {
    ON_SimpleArray<ON_2fPoint>::Destroy(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  }
  i_00 = (this->m_TC).m_count;
  while (0 < (int)i_00) {
    i_00 = i_00 - 1;
    if ((this->m_TC).m_a[i_00].m_T.m_count != iVar1) {
      ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,i_00);
    }
  }
  if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count != iVar1) {
    ON_SimpleArray<ON_2dPoint>::Destroy(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  }
  if ((this->m_K).m_count != iVar1) {
    ON_SimpleArray<ON_SurfaceCurvature>::Destroy(&this->m_K);
  }
  if ((this->m_C).m_count != iVar1) {
    ON_SimpleArray<ON_Color>::Destroy(&this->m_C);
  }
  if ((this->m_H).m_count != iVar1) {
    ON_SimpleArray<bool>::Destroy(&this->m_H);
  }
  CullUnusedVertices(this);
  ON_SimpleArray<ON_3fPoint>::Shrink(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  ON_SimpleArray<ON_MeshFace>::Shrink(&this->m_F);
  ON_SimpleArray<ON_3fVector>::Shrink(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  ON_SimpleArray<ON_3fVector>::Shrink(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
  ON_SimpleArray<ON_SurfaceCurvature>::Shrink(&this->m_K);
  ON_SimpleArray<ON_Color>::Shrink(&this->m_C);
  ON_SimpleArray<ON_2dPoint>::Shrink(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  ON_SimpleArray<ON_2fPoint>::Shrink(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  lVar2 = 0xa0;
  for (lVar3 = 0; lVar3 < (this->m_TC).m_count; lVar3 = lVar3 + 1) {
    ON_SimpleArray<ON_3fPoint>::Shrink
              ((ON_SimpleArray<ON_3fPoint> *)
               ((((this->m_TC).m_a)->m_tag).m_mapping_id.Data4 + lVar2 + -8));
    lVar2 = lVar2 + 0xb8;
  }
  return true;
}

Assistant:

bool ON_Mesh::Compact()
{
  unsigned int meshVcount = m_V.UnsignedCount();
  unsigned int meshFcount = m_F.UnsignedCount();

  if (m_FN.UnsignedCount() != meshFcount)
    m_FN.Destroy();

  if (m_N.UnsignedCount() != meshVcount)
    m_N.Destroy();

  if (m_T.UnsignedCount() != meshVcount)
    m_T.Destroy();

  for (int i = m_TC.Count() - 1; i >= 0; i--)
  {
    if (m_TC[i].m_T.UnsignedCount() != meshVcount)
      m_TC.Remove(i);
  }

  if (m_S.UnsignedCount() != meshVcount)
    m_S.Destroy();

  if (m_K.UnsignedCount() != meshVcount)
    m_K.Destroy();

  if (m_C.UnsignedCount() != meshVcount)
    m_C.Destroy();

  if (m_H.UnsignedCount() != meshVcount)
    m_H.Destroy();

  CullUnusedVertices();

  m_V.Shrink();
  m_F.Shrink();
  m_N.Shrink();
  m_FN.Shrink();
  m_K.Shrink();
  m_C.Shrink();
  m_S.Shrink();
  m_T.Shrink();

  for (int i = 0; i < m_TC.Count(); i++)
    m_TC[i].m_T.Shrink();

  return true;
}